

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundoview.cpp
# Opt level: O2

void __thiscall QUndoModel::setStackCurrentIndex(QUndoModel *this,QModelIndex *index)

{
  bool bVar1;
  long in_FS_OFFSET;
  QModelIndex QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_stack != (QUndoStack *)0x0) {
    selectedIndex(&QStack_38,this);
    bVar1 = ::comparesEqual(index,&QStack_38);
    if ((!bVar1) && (index->c == 0)) {
      QUndoStack::setIndex((int)this->m_stack);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUndoModel::setStackCurrentIndex(const QModelIndex &index)
{
    if (m_stack == nullptr)
        return;

    if (index == selectedIndex())
        return;

    if (index.column() != 0)
        return;

    m_stack->setIndex(index.row());
}